

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O3

int __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::FindKey
          (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
          IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *C)

{
  uint uVar1;
  pointer pbVar2;
  pointer pcVar3;
  pointer pcVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  Addr *pAVar8;
  uint uVar9;
  ulong uVar10;
  size_t sVar11;
  size_type *psVar12;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> D;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode(&local_b0,this->N);
  if ((this->RootAddr).FileOff != -1) {
    FindNode(this,this->RootAddr,C);
LAB_0012ca43:
    if (C->NodeState != '1') {
      iVar6 = this->N;
      if (iVar6 < 2) {
        uVar10 = 0;
      }
      else {
        uVar10 = 0;
        if (*(C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start == '1') {
          uVar7 = 1;
          while( true ) {
            uVar10 = uVar7;
            iVar5 = std::__cxx11::string::compare((string *)k);
            iVar6 = this->N;
            if (iVar5 < 1) break;
            if (((long)iVar6 + -1 <= (long)uVar10) ||
               (uVar7 = uVar10 + 1,
               (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar10] != '1')) goto LAB_0012caae;
          }
          uVar10 = uVar10 - 1;
        }
      }
LAB_0012caae:
      uVar7 = uVar10 & 0xffffffff;
      if (((int)uVar10 == iVar6 + -1) ||
         ((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar7] == '0')) goto LAB_0012cb04;
      pbVar2 = (C->k).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar11 = k->_M_string_length;
      if ((sVar11 != pbVar2[uVar7]._M_string_length) ||
         ((sVar11 != 0 &&
          (iVar6 = bcmp((k->_M_dataplus)._M_p,pbVar2[uVar7]._M_dataplus._M_p,sVar11), iVar6 != 0))))
      goto LAB_0012caf1;
      FindNode(this,(C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar7],&local_b0);
      local_110.NodeState = local_b0.NodeState;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_110.k,&local_b0.k);
      local_110.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_110.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_110.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
                (&local_110.v.super__Vector_base<char,_std::allocator<char>_>,
                 (long)local_b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
      pcVar4 = local_110.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar11 = (long)local_b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (sVar11 != 0) {
        memmove(local_110.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,
                local_b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,sVar11);
      }
      local_110.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar4 + sVar11;
      std::vector<Addr,_std::allocator<Addr>_>::vector(&local_110.p,&local_b0.p);
      local_110.parent.BlockNum = local_b0.parent.BlockNum;
      local_110.parent.FileOff = local_b0.parent.FileOff;
      local_110.self.BlockNum = local_b0.self.BlockNum;
      local_110.self.FileOff = local_b0.self.FileOff;
      pcVar3 = (k->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar3,pcVar3 + k->_M_string_length);
      iVar6 = HaveK(this,&local_110,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (local_110.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_110.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_110.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_110.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_110.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_110.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_110.k);
      pAVar8 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start + uVar7 + (iVar6 == 0);
      goto LAB_0012cb0c;
    }
    uVar1 = this->N - 1;
    uVar10 = 0;
    if (this->N < 2) {
LAB_0012ccd6:
      uVar9 = 0xffffffff;
      if (((uint)uVar10 != uVar1) &&
         (uVar9 = 0xffffffff,
         (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar10 & 0xffffffff] != '0')) {
        uVar9 = (uint)uVar10;
      }
      goto LAB_0012ccec;
    }
    pcVar4 = (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    psVar12 = &((C->k).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    uVar10 = 0;
    do {
      if ((pcVar4[uVar10] != '1') ||
         ((sVar11 = k->_M_string_length, sVar11 == *psVar12 &&
          ((sVar11 == 0 ||
           (iVar6 = bcmp((k->_M_dataplus)._M_p,
                         (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (psVar12 + -1))->_M_dataplus)._M_p,sVar11), iVar6 == 0))))))
      goto LAB_0012ccd6;
      uVar10 = uVar10 + 1;
      psVar12 = psVar12 + 4;
    } while (uVar1 != uVar10);
  }
  uVar9 = 0xffffffff;
LAB_0012ccec:
  if (local_b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.k);
  return uVar9;
LAB_0012caf1:
  iVar6 = std::__cxx11::string::compare((string *)k);
  if (iVar6 < 0) {
LAB_0012cb04:
    pAVar8 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
             _M_start + uVar7;
LAB_0012cb0c:
    FindNode(this,*pAVar8,C);
  }
  goto LAB_0012ca43;
}

Assistant:

int BpTree<K>::FindKey(K k, IndexNode<K>& C) {
	IndexNode<K> D(N);
	int i;
	if (this->RootAddr.FileOff == -1)		return -1;	//����ǿ�����ֱ�ӷ���-1
	this->FindNode(this->RootAddr, C);
	while (C.NodeState != LEAF) {
		for (i = 0; i < N - 1 && C.v[i] == '1' && k > C.k[i]; i++);
		if (i == N - 1 || C.v[i] == '0') {
			this->FindNode(C.p[i], C);
		}
		else if (k == C.k[i]) {
			this->FindNode(C.p[i], D);
			if(this->HaveK(D, k))
				this->FindNode(C.p[i], C);			//���C.p[i]������k����C = this->FindNode(C.p[i]);
			else
				this->FindNode(C.p[i + 1], C);		//���C.p[i]������k����C = this->FindNode(C.p[i + 1]);
		}
		else if (k < C.k[i]) {
			this->FindNode(C.p[i], C);
		}
	}
	for (i = 0; i < N - 1 && C.v[i] == '1'&& k != C.k[i]; i++);
	if (i == N - 1 || C.v[i] == '0') {
		return -1;		//δ�ҵ�
	}
	else {
		return i;		//�ҵ���
	}
}